

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

void TTD::NSSnapValues::ExtractSnapPrimitiveValue
               (SnapPrimitiveValue *snapValue,RecyclableObject *jsValue,bool isWellKnown,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *idToTypeMap,
               SlabAllocator *alloc)

{
  code *pcVar1;
  bool bVar2;
  PropertyId PVar3;
  charcount_t length;
  Entry *pEVar4;
  TTD_WELLKNOWN_TOKEN str;
  char16 *pcVar5;
  JavascriptBoolean *pJVar6;
  JavascriptTypedNumber<unsigned_long> *pJVar7;
  undefined4 *puVar8;
  TTString *pTVar9;
  JavascriptString *pJVar10;
  undefined7 in_register_00000011;
  
  snapValue->PrimitiveValueId = (TTD_PTR_ID)jsValue;
  pEVar4 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::FindSlotForId<false>
                     (idToTypeMap,(unsigned_long)(jsValue->type).ptr);
  snapValue->SnapType = pEVar4->Data;
  if ((int)CONCAT71(in_register_00000011,isWellKnown) == 0) {
    str = (char16 *)0x0;
  }
  else {
    str = RuntimeContextInfo::ResolvePathForKnownObject
                    (((((((jsValue->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase
                      ).scriptContext.ptr)->TTDWellKnownInfo,jsValue);
  }
  pcVar5 = SlabAllocatorBase<0>::CopyRawNullTerminatedStringInto(alloc,str);
  snapValue->OptWellKnownToken = pcVar5;
  if (pcVar5 != (char16 *)0x0) {
    return;
  }
  switch(snapValue->SnapType->JsTypeId) {
  case TypeIds_Undefined:
  case TypeIds_Null:
    goto switchD_0092ac41_caseD_0;
  case TypeIds_Boolean:
    pJVar6 = Js::VarTo<Js::JavascriptBoolean,Js::RecyclableObject>(jsValue);
    PVar3 = pJVar6->value;
    break;
  default:
    TTDAbort_unrecoverable_error
              (
              "These are supposed to be primitive values on the heap e.g., no pointers or properties."
              );
  case TypeIds_Number:
    if ((ulong)jsValue >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                         ,0xd4,"(Is(aValue))","Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    (snapValue->field_3).u_uint64Value = (ulong)jsValue ^ 0xfffc000000000000;
    return;
  case TypeIds_Int64Number:
    pJVar7 = (JavascriptTypedNumber<unsigned_long> *)
             Js::VarTo<Js::JavascriptTypedNumber<long>,Js::RecyclableObject>(jsValue);
    goto LAB_0092ac62;
  case TypeIds_LastNumberType:
    pJVar7 = Js::VarTo<Js::JavascriptTypedNumber<unsigned_long>,Js::RecyclableObject>(jsValue);
LAB_0092ac62:
    snapValue->field_3 = (anon_union_8_6_090a279e_for_SnapPrimitiveValue_3)pJVar7->m_value;
    return;
  case TypeIds_String:
    pTVar9 = (TTString *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
    (snapValue->field_3).u_stringValue = pTVar9;
    pJVar10 = Js::VarTo<Js::JavascriptString,Js::RecyclableObject>(jsValue);
    pcVar5 = Js::JavascriptString::GetString(pJVar10);
    pJVar10 = Js::VarTo<Js::JavascriptString,Js::RecyclableObject>(jsValue);
    length = Js::JavascriptString::GetLength(pJVar10);
    SlabAllocatorBase<0>::CopyStringIntoWLength
              (alloc,pcVar5,length,(snapValue->field_3).u_stringValue);
    return;
  case TypeIds_Symbol:
    PVar3 = Js::JavascriptLibrary::ExtractPrimitveSymbolId_TTD
                      ((((jsValue->type).ptr)->javascriptLibrary).ptr,jsValue);
  }
  (snapValue->field_3).u_propertyIdValue = PVar3;
switchD_0092ac41_caseD_0:
  return;
}

Assistant:

void ExtractSnapPrimitiveValue(SnapPrimitiveValue* snapValue, Js::RecyclableObject* jsValue, bool isWellKnown, const TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapType*>& idToTypeMap, SlabAllocator& alloc)
        {
            snapValue->PrimitiveValueId = TTD_CONVERT_VAR_TO_PTR_ID(jsValue);

            Js::Type* objType = jsValue->GetType();
            snapValue->SnapType = idToTypeMap.LookupKnownItem(TTD_CONVERT_TYPEINFO_TO_PTR_ID(objType));

            TTD_WELLKNOWN_TOKEN lookupToken = isWellKnown ? jsValue->GetScriptContext()->TTDWellKnownInfo->ResolvePathForKnownObject(jsValue) : TTD_INVALID_WELLKNOWN_TOKEN;
            snapValue->OptWellKnownToken = alloc.CopyRawNullTerminatedStringInto(lookupToken);

            if(snapValue->OptWellKnownToken == TTD_INVALID_WELLKNOWN_TOKEN)
            {
                Js::JavascriptLibrary* jslib = jsValue->GetLibrary();

                switch(snapValue->SnapType->JsTypeId)
                {
                case Js::TypeIds_Undefined:
                case Js::TypeIds_Null:
                    break;
                case Js::TypeIds_Boolean:
                    snapValue->u_boolValue = Js::VarTo<Js::JavascriptBoolean>(jsValue)->GetValue();
                    break;
                case Js::TypeIds_Number:
                    snapValue->u_doubleValue = Js::JavascriptNumber::GetValue(jsValue);
                    break;
                case Js::TypeIds_Int64Number:
                    snapValue->u_int64Value = Js::VarTo<Js::JavascriptInt64Number>(jsValue)->GetValue();
                    break;
                case Js::TypeIds_UInt64Number:
                    snapValue->u_uint64Value = Js::VarTo<Js::JavascriptUInt64Number>(jsValue)->GetValue();
                    break;
                case Js::TypeIds_String:
                    snapValue->u_stringValue = alloc.SlabAllocateStruct<TTString>();
                    alloc.CopyStringIntoWLength(Js::VarTo<Js::JavascriptString>(jsValue)->GetString(), Js::VarTo<Js::JavascriptString>(jsValue)->GetLength(), *(snapValue->u_stringValue));
                    break;
                case Js::TypeIds_Symbol:
                    snapValue->u_propertyIdValue = jslib->ExtractPrimitveSymbolId_TTD(jsValue);
                    break;
                default:
                    TTDAssert(false, "These are supposed to be primitive values on the heap e.g., no pointers or properties.");
                    break;
                }
            }
        }